

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compat.c
# Opt level: O1

char * strnstr(char *s,char *find,size_t slen)

{
  char cVar1;
  int iVar2;
  size_t __n;
  ulong uVar3;
  
  cVar1 = *find;
  if (cVar1 == '\0') {
    return s;
  }
  __n = strlen(find + 1);
  uVar3 = slen - 1;
  do {
    if (uVar3 == 0xffffffffffffffff) {
      return (char *)0x0;
    }
    if (*s == '\0') {
      return (char *)0x0;
    }
    if (*s == cVar1) {
      if (uVar3 < __n) {
        return (char *)0x0;
      }
      iVar2 = strncmp(s + 1,find + 1,__n);
      if (iVar2 == 0) {
        return s;
      }
    }
    uVar3 = uVar3 - 1;
    s = s + 1;
  } while( true );
}

Assistant:

char *
strnstr(const char *s, const char *find, size_t slen)
{
    char c, sc;
    size_t len;

    if ((c = *find++) != '\0') {
        len = strlen(find);
        do {
            do {
                if ((slen-- < 1) || ((sc = *s++) == '\0')) {
                    return NULL;
                }
            } while (sc != c);
            if (len > slen) {
                return NULL;
            }
        } while (strncmp(s, find, len));
        s--;
    }
    return (char *)s;
}